

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thinlenscamera.hpp
# Opt level: O2

void __thiscall ThinlensCamera::ThinlensCamera(ThinlensCamera *this,Json *conf)

{
  undefined1 *b;
  vec3f *a;
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  const_reference pvVar6;
  float fVar7;
  vec3f vVar8;
  float local_58;
  float fStack_54;
  vec3f local_40;
  vec3f local_30;
  
  Camera::Camera(&this->super_Camera,conf);
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR_sampleray_00160d60;
  b = &(this->super_Camera).field_0x3c;
  *(undefined8 *)&(this->super_Camera).field_0x3c = 0;
  *(undefined8 *)&this->field_0x44 = 0;
  (this->uphalf).y = 0.0;
  (this->uphalf).z = 0.0;
  (this->lefthalf).x = 0.0;
  (this->lefthalf).y = 0.0;
  (this->lefthalf).z = 0.0;
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"focaldistance");
  fVar7 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<float,_float,_0>(pvVar6);
  this->focaldistance = fVar7;
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"lensradius");
  fVar7 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<float,_float,_0>(pvVar6);
  this->lensradius = fVar7;
  vVar8 = operator-(&(this->super_Camera).look_at,&(this->super_Camera).position);
  local_40.z = vVar8.z;
  local_40._0_8_ = vVar8._0_8_;
  vVar8 = normalized(&local_40);
  *(long *)&(this->super_Camera).field_0x3c = vVar8._0_8_;
  *(float *)&this->field_0x44 = vVar8.z;
  a = &(this->super_Camera).up;
  vVar8 = cross(a,(vec3f *)b);
  local_30.z = vVar8.z;
  local_30._0_8_ = vVar8._0_8_;
  vVar8 = cross((vec3f *)b,&local_30);
  local_40.z = vVar8.z;
  local_40._0_8_ = vVar8._0_8_;
  vVar8 = normalized(&local_40);
  (this->super_Camera).up.x = (float)(int)vVar8._0_8_;
  (this->super_Camera).up.y = (float)(int)((ulong)vVar8._0_8_ >> 0x20);
  (this->super_Camera).up.z = vVar8.z;
  fVar7 = *(float *)&(this->super_Camera).field_0x3c;
  fVar1 = *(float *)&this->field_0x40;
  fVar2 = *(float *)&this->field_0x44;
  iVar3 = (this->super_Camera).resy;
  iVar4 = (this->super_Camera).resx;
  dVar5 = tan((double)((this->super_Camera).fov * 0.5));
  vVar8 = operator*((float)(dVar5 * (double)(((float)iVar3 *
                                             SQRT(fVar2 * fVar2 + fVar7 * fVar7 + fVar1 * fVar1)) /
                                            (float)iVar4)),a);
  (this->uphalf).x = (float)(int)vVar8._0_8_;
  (this->uphalf).y = (float)(int)((ulong)vVar8._0_8_ >> 0x20);
  (this->uphalf).z = vVar8.z;
  vVar8 = cross(a,(vec3f *)b);
  dVar5 = tan((double)((this->super_Camera).fov * 0.5));
  fVar7 = (float)dVar5;
  local_58 = vVar8.x;
  fStack_54 = vVar8.y;
  (this->lefthalf).x = fVar7 * local_58;
  (this->lefthalf).y = fVar7 * fStack_54;
  (this->lefthalf).z = vVar8.z * fVar7;
  if ((this->super_Camera).mirror == true) {
    vVar8 = operator-(&this->lefthalf);
    (this->lefthalf).x = (float)(int)vVar8._0_8_;
    (this->lefthalf).y = (float)(int)((ulong)vVar8._0_8_ >> 0x20);
    (this->lefthalf).z = vVar8.z;
  }
  return;
}

Assistant:

ThinlensCamera(const Json& conf): Camera(conf) {
		focaldistance = conf["focaldistance"];
		lensradius = conf["lensradius"];
		dir = normalized(look_at - position);
		up = normalized(cross(dir, cross(up, dir)));
		uphalf = norm(dir) * resy / resx * tan(fov/2) * up;
		lefthalf = cross(up, dir) * tan(fov/2);
		if (mirror) lefthalf = -lefthalf;
	}